

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channeluser.c
# Opt level: O1

_Bool chirc_channeluser_get_or_create
                (chirc_channel_t *channel,chirc_user_t *user,chirc_channeluser_t **channeluser)

{
  UT_hash_bucket *pUVar1;
  chirc_channeluser_t *pcVar2;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  uchar *_hj_key;
  chirc_channeluser_t *pcVar5;
  chirc_channeluser_t *pcVar7;
  UT_hash_bucket *pUVar8;
  ulong uVar9;
  UT_hash_table *pUVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  size_t sVar16;
  byte local_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  int iStack_3c;
  UT_hash_handle *pUVar6;
  
  *channeluser = (chirc_channeluser_t *)0x0;
  if (channel->users != (chirc_channeluser_t *)0x0) {
    iStack_3c = (int)((ulong)user >> 0x20);
    bStack_3d = (byte)((ulong)user >> 0x18);
    bStack_3e = (byte)((ulong)user >> 0x10);
    bStack_3f = (byte)((ulong)user >> 8);
    local_40 = (byte)user;
    *channeluser = (chirc_channeluser_t *)0x0;
    if (channel->users != (chirc_channeluser_t *)0x0) {
      uVar14 = (uint)local_40 +
               ((uint)bStack_3d * 0x1000000 - (iStack_3c + -0x61c88647)) +
               (uint)bStack_3f * 0x100 + (uint)bStack_3e * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
      uVar13 = uVar14 << 8 ^ ((iStack_3c + -0x61c88647) - uVar14) + 0x1124109;
      uVar11 = uVar13 >> 0xd ^ (-0x1124109 - uVar14) - uVar13;
      uVar15 = uVar11 >> 0xc ^ (uVar14 - uVar13) - uVar11;
      uVar14 = uVar15 << 0x10 ^ (uVar13 - uVar11) - uVar15;
      uVar13 = uVar14 >> 5 ^ (uVar11 - uVar15) - uVar14;
      uVar15 = uVar13 >> 3 ^ (uVar15 - uVar14) - uVar13;
      uVar11 = uVar15 << 10 ^ (uVar14 - uVar13) - uVar15;
      uVar11 = uVar11 >> 0xf ^ uVar13 - (uVar15 + uVar11);
      pUVar10 = (channel->users->hh_from_channel).tbl;
      pUVar6 = pUVar10->buckets[pUVar10->num_buckets - 1 & uVar11].hh_head;
      if (pUVar6 != (UT_hash_handle *)0x0) goto LAB_001026fc;
      do {
        pcVar5 = (chirc_channeluser_t *)0x0;
        while( true ) {
          *channeluser = pcVar5;
          if ((pcVar5 == (chirc_channeluser_t *)0x0) ||
             ((((pcVar5->hh_from_channel).hashv == uVar11 && ((pcVar5->hh_from_channel).keylen == 8)
               ) && (*(pcVar5->hh_from_channel).key == user)))) goto LAB_0010273d;
          pUVar6 = (pcVar5->hh_from_channel).hh_next;
          if (pUVar6 == (UT_hash_handle *)0x0) break;
          pUVar10 = (channel->users->hh_from_channel).tbl;
LAB_001026fc:
          pcVar5 = (chirc_channeluser_t *)((long)pUVar6 - pUVar10->hho);
        }
      } while( true );
    }
  }
LAB_0010273d:
  pcVar5 = *channeluser;
  if (pcVar5 == (chirc_channeluser_t *)0x0) {
    pcVar7 = (chirc_channeluser_t *)malloc(0x90);
    *channeluser = pcVar7;
    pcVar7->user = (chirc_user_t *)0x0;
    pcVar7->channel = (chirc_channel_t *)0x0;
    pcVar7->modes[0] = '\0';
    pcVar7->channel = channel;
    pcVar7->user = user;
    iVar12 = *(int *)((long)&pcVar7->channel + 4) + -0x61c88647;
    uVar14 = ((uint)channel & 0xff) +
             ((uint)*(byte *)((long)&pcVar7->channel + 3) * 0x1000000 - iVar12) +
             (uint)*(byte *)((long)&pcVar7->channel + 1) * 0x100 +
             (uint)*(byte *)((long)&pcVar7->channel + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
    uVar13 = uVar14 << 8 ^ (iVar12 - uVar14) + 0x1124109;
    uVar11 = uVar13 >> 0xd ^ (-0x1124109 - uVar14) - uVar13;
    uVar15 = uVar11 >> 0xc ^ (uVar14 - uVar13) - uVar11;
    uVar14 = uVar15 << 0x10 ^ (uVar13 - uVar11) - uVar15;
    uVar13 = uVar14 >> 5 ^ (uVar11 - uVar15) - uVar14;
    uVar11 = uVar13 >> 3 ^ (uVar15 - uVar14) - uVar13;
    uVar14 = uVar11 << 10 ^ (uVar14 - uVar13) - uVar11;
    uVar11 = uVar14 >> 0xf ^ uVar13 - (uVar11 + uVar14);
    (pcVar7->hh_from_user).hashv = uVar11;
    (pcVar7->hh_from_user).key = &pcVar7->channel;
    (pcVar7->hh_from_user).keylen = 8;
    pcVar2 = user->channels;
    if (pcVar2 == (chirc_channeluser_t *)0x0) {
      pUVar10 = (UT_hash_table *)malloc(0x40);
      (pcVar7->hh_from_user).prev = (void *)0x0;
      (pcVar7->hh_from_user).next = (void *)0x0;
      (pcVar7->hh_from_user).tbl = pUVar10;
      if (pUVar10 == (UT_hash_table *)0x0) goto LAB_00102e39;
      *(undefined8 *)&pUVar10->num_items = 0;
      pUVar10->tail = (UT_hash_handle *)0x0;
      pUVar10->buckets = (UT_hash_bucket *)0x0;
      pUVar10->num_buckets = 0;
      pUVar10->log2_num_buckets = 0;
      pUVar10->hho = 0;
      pUVar10->ideal_chain_maxlen = 0;
      pUVar10->nonideal_items = 0;
      pUVar10->ineff_expands = 0;
      pUVar10->noexpand = 0;
      *(undefined8 *)&pUVar10->signature = 0;
      pUVar10->tail = &pcVar7->hh_from_user;
      pUVar10->num_buckets = 0x20;
      pUVar10->log2_num_buckets = 5;
      pUVar10->hho = 0x20;
      pUVar8 = (UT_hash_bucket *)malloc(0x200);
      pUVar10->buckets = pUVar8;
      pUVar10->signature = 0xa0111fe1;
      if (pUVar8 == (UT_hash_bucket *)0x0) goto LAB_00102e39;
      memset(pUVar8,0,0x200);
      user->channels = pcVar7;
    }
    else {
      (pcVar7->hh_from_user).tbl = (pcVar2->hh_from_user).tbl;
      (pcVar7->hh_from_user).next = (void *)0x0;
      pUVar10 = (pcVar2->hh_from_user).tbl;
      pUVar6 = pUVar10->tail;
      (pcVar7->hh_from_user).prev = (void *)((long)pUVar6 - pUVar10->hho);
      pUVar6->next = pcVar7;
      pUVar10->tail = &(*channeluser)->hh_from_user;
    }
    pUVar10 = (user->channels->hh_from_user).tbl;
    pUVar10->num_items = pUVar10->num_items + 1;
    uVar11 = pUVar10->num_buckets - 1 & uVar11;
    pUVar8 = pUVar10->buckets;
    uVar13 = pUVar8[uVar11].count + 1;
    pUVar8[uVar11].count = uVar13;
    pUVar6 = pUVar8[uVar11].hh_head;
    ((*channeluser)->hh_from_user).hh_next = pUVar6;
    ((*channeluser)->hh_from_user).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar6 != (UT_hash_handle *)0x0) {
      pUVar6->hh_prev = &(*channeluser)->hh_from_user;
    }
    pUVar8[uVar11].hh_head = &(*channeluser)->hh_from_user;
    if (pUVar8[uVar11].expand_mult * 10 + 10 <= uVar13) {
      pcVar2 = *channeluser;
      pUVar10 = (pcVar2->hh_from_user).tbl;
      if (pUVar10->noexpand == 0) {
        sVar16 = (ulong)pUVar10->num_buckets << 5;
        pUVar8 = (UT_hash_bucket *)malloc(sVar16);
        if (pUVar8 == (UT_hash_bucket *)0x0) goto LAB_00102e39;
        uVar11 = 0;
        memset(pUVar8,0,sVar16);
        pUVar10 = (pcVar2->hh_from_user).tbl;
        pUVar10->ideal_chain_maxlen =
             ((pUVar10->num_items >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((pUVar10->num_buckets * 2 - 1 & pUVar10->num_items) == 0);
        pUVar10->nonideal_items = 0;
        pUVar10 = ((*channeluser)->hh_from_user).tbl;
        if (pUVar10->num_buckets != 0) {
          uVar9 = 0;
          do {
            pUVar6 = pUVar10->buckets[uVar9].hh_head;
            while (pUVar6 != (UT_hash_handle *)0x0) {
              pUVar10 = ((*channeluser)->hh_from_user).tbl;
              uVar14 = pUVar10->num_buckets * 2 - 1 & pUVar6->hashv;
              pUVar3 = pUVar6->hh_next;
              pUVar1 = pUVar8 + uVar14;
              uVar13 = pUVar8[uVar14].count + 1;
              pUVar8[uVar14].count = uVar13;
              if (pUVar10->ideal_chain_maxlen < uVar13) {
                pUVar10->nonideal_items = pUVar10->nonideal_items + 1;
                if (pUVar10->ideal_chain_maxlen * pUVar1->expand_mult < uVar13) {
                  pUVar1->expand_mult = pUVar1->expand_mult + 1;
                }
              }
              pUVar6->hh_prev = (UT_hash_handle *)0x0;
              pUVar4 = pUVar1->hh_head;
              pUVar6->hh_next = pUVar4;
              if (pUVar4 != (UT_hash_handle *)0x0) {
                pUVar4->hh_prev = pUVar6;
              }
              pUVar1->hh_head = pUVar6;
              pUVar6 = pUVar3;
            }
            uVar9 = uVar9 + 1;
            pUVar10 = ((*channeluser)->hh_from_user).tbl;
          } while (uVar9 < pUVar10->num_buckets);
        }
        free(pUVar10->buckets);
        pUVar10 = ((*channeluser)->hh_from_user).tbl;
        pUVar10->num_buckets = pUVar10->num_buckets << 1;
        pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
        pUVar10->buckets = pUVar8;
        pUVar10 = ((*channeluser)->hh_from_user).tbl;
        if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
          uVar11 = pUVar10->ineff_expands + 1;
        }
        pUVar10->ineff_expands = uVar11;
        if (1 < uVar11) {
          pUVar10->noexpand = 1;
        }
      }
    }
    pcVar2 = *channeluser;
    iVar12 = *(int *)((long)&pcVar2->user + 4) + -0x61c88647;
    uVar14 = (uint)*(byte *)&pcVar2->user +
             ((uint)*(byte *)((long)&pcVar2->user + 3) * 0x1000000 - iVar12) +
             (uint)*(byte *)((long)&pcVar2->user + 1) * 0x100 +
             (uint)*(byte *)((long)&pcVar2->user + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
    uVar13 = uVar14 << 8 ^ (iVar12 - uVar14) + 0x1124109;
    uVar11 = uVar13 >> 0xd ^ (-0x1124109 - uVar14) - uVar13;
    uVar15 = uVar11 >> 0xc ^ (uVar14 - uVar13) - uVar11;
    uVar14 = uVar15 << 0x10 ^ (uVar13 - uVar11) - uVar15;
    uVar13 = uVar14 >> 5 ^ (uVar11 - uVar15) - uVar14;
    uVar11 = uVar13 >> 3 ^ (uVar15 - uVar14) - uVar13;
    uVar14 = uVar11 << 10 ^ (uVar14 - uVar13) - uVar11;
    uVar11 = uVar14 >> 0xf ^ uVar13 - (uVar11 + uVar14);
    (pcVar2->hh_from_channel).hashv = uVar11;
    (pcVar2->hh_from_channel).key = pcVar2;
    pcVar2 = *channeluser;
    (pcVar2->hh_from_channel).keylen = 8;
    pcVar7 = channel->users;
    if (pcVar7 == (chirc_channeluser_t *)0x0) {
      (pcVar2->hh_from_channel).next = (void *)0x0;
      ((*channeluser)->hh_from_channel).prev = (void *)0x0;
      pUVar10 = (UT_hash_table *)malloc(0x40);
      ((*channeluser)->hh_from_channel).tbl = pUVar10;
      pUVar10 = ((*channeluser)->hh_from_channel).tbl;
      if (pUVar10 == (UT_hash_table *)0x0) goto LAB_00102e39;
      pUVar10->ineff_expands = 0;
      pUVar10->noexpand = 0;
      *(undefined8 *)&pUVar10->signature = 0;
      pUVar10->hho = 0;
      pUVar10->ideal_chain_maxlen = 0;
      pUVar10->nonideal_items = 0;
      *(undefined8 *)&pUVar10->num_items = 0;
      pUVar10->tail = (UT_hash_handle *)0x0;
      pUVar10->buckets = (UT_hash_bucket *)0x0;
      pUVar10->num_buckets = 0;
      pUVar10->log2_num_buckets = 0;
      (((*channeluser)->hh_from_channel).tbl)->tail = &(*channeluser)->hh_from_channel;
      pUVar10 = ((*channeluser)->hh_from_channel).tbl;
      pUVar10->num_buckets = 0x20;
      pUVar10->log2_num_buckets = 5;
      pUVar10->hho = 0x58;
      pUVar8 = (UT_hash_bucket *)malloc(0x200);
      pUVar10->buckets = pUVar8;
      pUVar10 = ((*channeluser)->hh_from_channel).tbl;
      pUVar10->signature = 0xa0111fe1;
      pUVar8 = pUVar10->buckets;
      if (pUVar8 == (UT_hash_bucket *)0x0) goto LAB_00102e39;
      memset(pUVar8,0,0x200);
      channel->users = *channeluser;
    }
    else {
      (pcVar2->hh_from_channel).tbl = (pcVar7->hh_from_channel).tbl;
      ((*channeluser)->hh_from_channel).next = (void *)0x0;
      pUVar10 = (pcVar7->hh_from_channel).tbl;
      pUVar6 = pUVar10->tail;
      ((*channeluser)->hh_from_channel).prev = (void *)((long)pUVar6 - pUVar10->hho);
      pUVar6->next = *channeluser;
      pUVar10->tail = &(*channeluser)->hh_from_channel;
    }
    pUVar10 = (channel->users->hh_from_channel).tbl;
    pUVar10->num_items = pUVar10->num_items + 1;
    uVar11 = pUVar10->num_buckets - 1 & uVar11;
    pUVar8 = pUVar10->buckets;
    uVar13 = pUVar8[uVar11].count + 1;
    pUVar8[uVar11].count = uVar13;
    pUVar6 = pUVar8[uVar11].hh_head;
    ((*channeluser)->hh_from_channel).hh_next = pUVar6;
    ((*channeluser)->hh_from_channel).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar6 != (UT_hash_handle *)0x0) {
      pUVar6->hh_prev = &(*channeluser)->hh_from_channel;
    }
    pUVar8[uVar11].hh_head = &(*channeluser)->hh_from_channel;
    if (pUVar8[uVar11].expand_mult * 10 + 10 <= uVar13) {
      pcVar2 = *channeluser;
      pUVar10 = (pcVar2->hh_from_channel).tbl;
      if (pUVar10->noexpand == 0) {
        sVar16 = (ulong)pUVar10->num_buckets << 5;
        pUVar8 = (UT_hash_bucket *)malloc(sVar16);
        if (pUVar8 == (UT_hash_bucket *)0x0) {
LAB_00102e39:
          exit(-1);
        }
        uVar11 = 0;
        memset(pUVar8,0,sVar16);
        pUVar10 = (pcVar2->hh_from_channel).tbl;
        pUVar10->ideal_chain_maxlen =
             ((pUVar10->num_items >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((pUVar10->num_buckets * 2 - 1 & pUVar10->num_items) == 0);
        pUVar10->nonideal_items = 0;
        pUVar10 = ((*channeluser)->hh_from_channel).tbl;
        if (pUVar10->num_buckets != 0) {
          uVar9 = 0;
          do {
            pUVar6 = pUVar10->buckets[uVar9].hh_head;
            while (pUVar6 != (UT_hash_handle *)0x0) {
              pUVar10 = ((*channeluser)->hh_from_channel).tbl;
              uVar14 = pUVar10->num_buckets * 2 - 1 & pUVar6->hashv;
              pUVar3 = pUVar6->hh_next;
              pUVar1 = pUVar8 + uVar14;
              uVar13 = pUVar8[uVar14].count + 1;
              pUVar8[uVar14].count = uVar13;
              if (pUVar10->ideal_chain_maxlen < uVar13) {
                pUVar10->nonideal_items = pUVar10->nonideal_items + 1;
                if (pUVar10->ideal_chain_maxlen * pUVar1->expand_mult < uVar13) {
                  pUVar1->expand_mult = pUVar1->expand_mult + 1;
                }
              }
              pUVar6->hh_prev = (UT_hash_handle *)0x0;
              pUVar4 = pUVar1->hh_head;
              pUVar6->hh_next = pUVar4;
              if (pUVar4 != (UT_hash_handle *)0x0) {
                pUVar4->hh_prev = pUVar6;
              }
              pUVar1->hh_head = pUVar6;
              pUVar6 = pUVar3;
            }
            uVar9 = uVar9 + 1;
            pUVar10 = ((*channeluser)->hh_from_channel).tbl;
          } while (uVar9 < pUVar10->num_buckets);
        }
        free(pUVar10->buckets);
        pUVar10 = ((*channeluser)->hh_from_channel).tbl;
        pUVar10->num_buckets = pUVar10->num_buckets << 1;
        pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
        pUVar10->buckets = pUVar8;
        pUVar10 = ((*channeluser)->hh_from_channel).tbl;
        if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
          uVar11 = pUVar10->ineff_expands + 1;
        }
        pUVar10->ineff_expands = uVar11;
        if (1 < uVar11) {
          pUVar10->noexpand = 1;
        }
      }
    }
  }
  return pcVar5 == (chirc_channeluser_t *)0x0;
}

Assistant:

bool chirc_channeluser_get_or_create(chirc_channel_t *channel, chirc_user_t *user, chirc_channeluser_t **channeluser)
{
    bool created;

    HASH_FIND(hh_from_channel,channel->users, &user,sizeof(chirc_user_t *), *channeluser);
    if(*channeluser)
    {
        created = false;
    }
    else
    {
        created = true;

        *channeluser = malloc(sizeof(chirc_channeluser_t));
        chirc_channeluser_init(*channeluser);
        (*channeluser)->channel = channel;
        (*channeluser)->user = user;
        HASH_ADD(hh_from_user, user->channels, channel, sizeof(chirc_channel_t *), *channeluser);
        HASH_ADD(hh_from_channel, channel->users, user, sizeof(chirc_user_t *), *channeluser);
    }

    return created;
}